

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Empty.hpp
# Opt level: O3

string * __thiscall
ut11::Operands::IsEmpty::GetErrorMessage<char[3]>
          (string *__return_storage_ptr__,IsEmpty *this,char (*actual) [3])

{
  size_t sVar1;
  stringstream errorMessage;
  char *local_350;
  long local_348;
  char local_340 [16];
  stringstream local_330 [16];
  ostream local_320 [112];
  ios_base local_2b0 [264];
  stringstream local_1a8 [16];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::stringstream::stringstream(local_330);
  std::__ostream_insert<char,std::char_traits<char>>(local_320,"Expected empty but was ",0x17);
  std::__cxx11::stringstream::stringstream(local_1a8);
  sVar1 = strlen(*actual);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,*actual,sVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(local_128);
  std::__ostream_insert<char,std::char_traits<char>>(local_320,local_350,local_348);
  if (local_350 != local_340) {
    operator_delete(local_350);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_330);
  std::ios_base::~ios_base(local_2b0);
  return __return_storage_ptr__;
}

Assistant:

inline std::string GetErrorMessage(const U& actual) const
			{
				std::stringstream errorMessage;
				errorMessage << "Expected empty but was " << utility::ToString(actual);
				return errorMessage.str();
			}